

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMD::SPFForceManager::~SPFForceManager(SPFForceManager *this)

{
  Snapshot *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pVVar3;
  pointer piVar4;
  Thermo *pTVar5;
  
  (this->super_ForceManager)._vptr_ForceManager = (_func_int **)&PTR__SPFForceManager_002ff9e0;
  pSVar1 = this->temporarySourceSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
  }
  operator_delete(pSVar1,0xa98);
  pSVar1 = this->temporarySinkSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
  }
  operator_delete(pSVar1,0xa98);
  pVVar3 = (this->sinkSavedPositions_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->sinkSavedPositions_).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  piVar4 = (this->sinkPoint_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->sinkPoint_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  piVar4 = (this->sinkNeighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->sinkNeighborList_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  pVVar3 = (this->sourceSavedPositions_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->sourceSavedPositions_).
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  piVar4 = (this->sourcePoint_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->sourcePoint_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  piVar4 = (this->sourceNeighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->sourceNeighborList_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  pTVar5 = (this->thermo_)._M_t.
           super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>._M_t.
           super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>.
           super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl;
  if (pTVar5 != (Thermo *)0x0) {
    operator_delete(pTVar5,8);
  }
  (this->thermo_)._M_t.super___uniq_ptr_impl<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>.
  _M_t.super__Tuple_impl<0UL,_OpenMD::Thermo_*,_std::default_delete<OpenMD::Thermo>_>.
  super__Head_base<0UL,_OpenMD::Thermo_*,_false>._M_head_impl = (Thermo *)0x0;
  ForceManager::~ForceManager(&this->super_ForceManager);
  return;
}

Assistant:

SPFForceManager::~SPFForceManager() {
    delete temporarySourceSnapshot_;
    delete temporarySinkSnapshot_;
  }